

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_unittests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4527::NormaliseColorTest_multi_channel_test_Test::TestBody
          (NormaliseColorTest_multi_channel_test_Test *this)

{
  color<unsigned_int,_4U> input;
  color<unsigned_int,_4U> input_00;
  color<unsigned_int,_4U> input_01;
  undefined8 unaff_RBP;
  undefined8 unaff_R12;
  anon_union_8_2_6556a7fb_for_color<unsigned_short,_4U>_3 unaff_R14;
  anon_union_8_2_6556a7fb_for_color<unsigned_short,_4U>_3 unaff_R15;
  color<unsigned_int,_3U> input_02;
  color<unsigned_int,_3U> input_03;
  color<unsigned_int,_3U> output;
  color<unsigned_int,_3U> output_00;
  color<unsigned_int,_3U> output_01;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  
  (anonymous_namespace)::test_color<color<unsigned_char,4u>>
            ((color<unsigned_char,_4U>)unaff_R15._4_4_,(color<unsigned_char,_4U>)unaff_R15._0_4_);
  (anonymous_namespace)::test_color<color<unsigned_char,4u>>
            ((color<unsigned_char,_4U>)unaff_R15._4_4_,(color<unsigned_char,_4U>)unaff_R15._0_4_);
  (anonymous_namespace)::test_color<color<unsigned_char,4u>>
            ((color<unsigned_char,_4U>)unaff_R15._4_4_,(color<unsigned_char,_4U>)unaff_R15._0_4_);
  (anonymous_namespace)::test_color<color<unsigned_short,4u>>
            ((color<unsigned_short,_4U>)unaff_R15.field_1,
             (color<unsigned_short,_4U>)unaff_R14.field_1);
  (anonymous_namespace)::test_color<color<unsigned_short,4u>>
            ((color<unsigned_short,_4U>)unaff_R15.field_1,
             (color<unsigned_short,_4U>)unaff_R14.field_1);
  (anonymous_namespace)::test_color<color<unsigned_short,4u>>
            ((color<unsigned_short,_4U>)unaff_R15.field_1,
             (color<unsigned_short,_4U>)unaff_R14.field_1);
  input.field_0._8_8_ = unaff_retaddr;
  input.field_0._0_8_ = unaff_RBP;
  (anonymous_namespace)::test_color<color<unsigned_int,4u>>
            (input,(color<unsigned_int,_4U>)in_stack_00000008);
  input_00.field_0._8_8_ = unaff_retaddr;
  input_00.field_0._0_8_ = unaff_RBP;
  (anonymous_namespace)::test_color<color<unsigned_int,4u>>
            (input_00,(color<unsigned_int,_4U>)in_stack_00000008);
  input_01.field_0._8_8_ = unaff_retaddr;
  input_01.field_0._0_8_ = unaff_RBP;
  (anonymous_namespace)::test_color<color<unsigned_int,4u>>
            (input_01,(color<unsigned_int,_4U>)in_stack_00000008);
  (anonymous_namespace)::test_color<color<unsigned_char,3u>>
            ((color<unsigned_char,_3U>)SUB83((ulong)unaff_R12 >> 0x20,0),
             (color<unsigned_char,_3U>)SUB83(unaff_R12,0));
  (anonymous_namespace)::test_color<color<unsigned_char,3u>>
            ((color<unsigned_char,_3U>)SUB83((ulong)unaff_R12 >> 0x20,0),
             (color<unsigned_char,_3U>)SUB83(unaff_R12,0));
  (anonymous_namespace)::test_color<color<unsigned_char,3u>>
            ((color<unsigned_char,_3U>)SUB83((ulong)unaff_R12 >> 0x20,0),
             (color<unsigned_char,_3U>)SUB83(unaff_R12,0));
  (anonymous_namespace)::test_color<color<unsigned_short,3u>>
            ((color<unsigned_short,_3U>)unaff_R15._0_6_,(color<unsigned_short,_3U>)unaff_R14._0_6_);
  (anonymous_namespace)::test_color<color<unsigned_short,3u>>
            ((color<unsigned_short,_3U>)unaff_R15._0_6_,(color<unsigned_short,_3U>)unaff_R14._0_6_);
  (anonymous_namespace)::test_color<color<unsigned_short,3u>>
            ((color<unsigned_short,_3U>)unaff_R15._0_6_,(color<unsigned_short,_3U>)unaff_R14._0_6_);
  output.field_0.comps[2] = 0x36196300;
  output.field_0._0_8_ = 0x3619630036196300;
  (anonymous_namespace)::test_color<color<unsigned_int,3u>>
            ((color<unsigned_int,_3U>)ZEXT812(0),output);
  input_02.field_0.comps[2] = 0xffffffff;
  input_02.field_0._0_8_ = 0xffffffffffffffff;
  output_00.field_0.comps[2] = 0xc9e69d00;
  output_00.field_0._0_8_ = 0xc9e69d00c9e69d00;
  (anonymous_namespace)::test_color<color<unsigned_int,3u>>(input_02,output_00);
  input_03.field_0.comps[2] = 0xb2;
  input_03.field_0._0_8_ = 0xbf0000001f;
  output_01.field_0.comps[2] = 0x36196300;
  output_01.field_0._0_8_ = 0x3619630036196300;
  (anonymous_namespace)::test_color<color<unsigned_int,3u>>(input_03,output_01);
  (anonymous_namespace)::test_color<color<unsigned_char,2u>>
            ((color<unsigned_char,_2U>)0x0,(color<unsigned_char,_2U>)0x2525);
  (anonymous_namespace)::test_color<color<unsigned_char,2u>>
            ((color<unsigned_char,_2U>)0xffff,(color<unsigned_char,_2U>)0xdada);
  (anonymous_namespace)::test_color<color<unsigned_char,2u>>
            ((color<unsigned_char,_2U>)0xbf1f,(color<unsigned_char,_2U>)0xc615);
  (anonymous_namespace)::test_color<color<unsigned_short,2u>>
            ((color<unsigned_short,_2U>)0x0,(color<unsigned_short,_2U>)0x257d257d);
  (anonymous_namespace)::test_color<color<unsigned_short,2u>>
            ((color<unsigned_short,_2U>)0xffffffff,(color<unsigned_short,_2U>)0xda82da82);
  (anonymous_namespace)::test_color<color<unsigned_short,2u>>
            ((color<unsigned_short,_2U>)0xbf001f,(color<unsigned_short,_2U>)0x25b62545);
  (anonymous_namespace)::test_color<color<unsigned_int,2u>>
            ((color<unsigned_int,_2U>)0x0,(color<unsigned_int,_2U>)0x257d8680257d8680);
  (anonymous_namespace)::test_color<color<unsigned_int,2u>>
            ((color<unsigned_int,_2U>)0xffffffffffffffff,(color<unsigned_int,_2U>)0xda827a00da827a00
            );
  (anonymous_namespace)::test_color<color<unsigned_int,2u>>
            ((color<unsigned_int,_2U>)0xbf0000001f,(color<unsigned_int,_2U>)0x257d8680257d8680);
  (anonymous_namespace)::test_color<color<unsigned_char,1u>>
            ((color<unsigned_char,_1U>)0x0,(color<unsigned_char,_1U>)0x0);
  (anonymous_namespace)::test_color<color<unsigned_char,1u>>
            ((color<unsigned_char,_1U>)0xff,(color<unsigned_char,_1U>)0xff);
  (anonymous_namespace)::test_color<color<unsigned_char,1u>>
            ((color<unsigned_char,_1U>)0x1f,(color<unsigned_char,_1U>)0xff);
  (anonymous_namespace)::test_color<color<unsigned_short,1u>>
            ((color<unsigned_short,_1U>)0x0,(color<unsigned_short,_1U>)0x0);
  (anonymous_namespace)::test_color<color<unsigned_short,1u>>
            ((color<unsigned_short,_1U>)0xffff,(color<unsigned_short,_1U>)0xffff);
  (anonymous_namespace)::test_color<color<unsigned_short,1u>>
            ((color<unsigned_short,_1U>)0x1f,(color<unsigned_short,_1U>)0xffff);
  (anonymous_namespace)::test_color<color<unsigned_int,1u>>
            ((color<unsigned_int,_1U>)0x0,(color<unsigned_int,_1U>)0x0);
  (anonymous_namespace)::test_color<color<unsigned_int,1u>>
            ((color<unsigned_int,_1U>)0xffffffff,(color<unsigned_int,_1U>)0xffffffff);
  (anonymous_namespace)::test_color<color<unsigned_int,1u>>
            ((color<unsigned_int,_1U>)0x1f,(color<unsigned_int,_1U>)0xffffffff);
  return;
}

Assistant:

void test_by_channel( const uint32_t min_res[], const uint32_t max_res[],
    const uint32_t some_res8[], const uint32_t some_res16[], const uint32_t some_res32[]) {
    {
        color<uint8_t, componentCount> c8i{(uint8_t)min_val, (uint8_t)min_val, (uint8_t)min_val, (uint8_t)min_val};
        color<uint8_t, componentCount> c8o{(uint8_t)min_res[0], (uint8_t)min_res[0], (uint8_t)min_res[0], 0};
        test_color(c8i, c8o);
    }
    {
        color<uint8_t, componentCount> c8i{(uint8_t)max_val[0], (uint8_t)max_val[0], (uint8_t)max_val[0], (uint8_t)max_val[0]};
        color<uint8_t, componentCount> c8o{(uint8_t)max_res[0], (uint8_t)max_res[0], (uint8_t)max_res[0], (uint8_t)max_val[0]};
        test_color(c8i, c8o);
    }
    {
        color<uint8_t, componentCount> c8i{(uint8_t)some_val[0], (uint8_t)some_val[1], (uint8_t)some_val[2], 0};
        color<uint8_t, componentCount> c8o{(uint8_t)some_res8[0], (uint8_t)some_res8[1], (uint8_t)some_res8[2], 0};
        test_color(c8i, c8o);
    }
    {
        color<uint16_t, componentCount> c16i{(uint16_t)min_val, (uint16_t)min_val, (uint16_t)min_val, (uint16_t)min_val};
        color<uint16_t, componentCount> c16o{(uint16_t)min_res[1], (uint16_t)min_res[1], (uint16_t)min_res[1], 0};
        test_color(c16i, c16o);
    }
    {
        color<uint16_t, componentCount> c16i{(uint16_t)max_val[1], (uint16_t)max_val[1], (uint16_t)max_val[1], (uint16_t)max_val[1]};
        color<uint16_t, componentCount> c16o{(uint16_t)max_res[1], (uint16_t)max_res[1], (uint16_t)max_res[1], (uint16_t)max_val[1]};
        test_color(c16i, c16o);
    }
    {
        color<uint16_t, componentCount> c16i{(uint16_t)some_val[0], (uint16_t)some_val[1], (uint16_t)some_val[2], 0};
        color<uint16_t, componentCount> c16o{(uint16_t)some_res16[0], (uint16_t)some_res16[1], (uint16_t)some_res16[2], 0};
        test_color(c16i, c16o);
    }
    {
        color<uint32_t, componentCount> c32i{(uint32_t)min_val, (uint32_t)min_val, (uint32_t)min_val, (uint32_t)min_val};
        color<uint32_t, componentCount> c32o{(uint32_t)min_res[2], (uint32_t)min_res[2], (uint32_t)min_res[2], 0};
        test_color(c32i, c32o);
    }
    {
        color<uint32_t, componentCount> c32i{(uint32_t)max_val[2], (uint32_t)max_val[2], (uint32_t)max_val[2], (uint32_t)max_val[2]};
        color<uint32_t, componentCount> c32o{(uint32_t)max_res[2], (uint32_t)max_res[2], (uint32_t)max_res[2], (uint32_t)max_val[2]};
        test_color(c32i, c32o);
    }
    {
        color<uint32_t, componentCount> c32i{(uint32_t)some_val[0], (uint32_t)some_val[1], (uint32_t)some_val[2], 0};
        color<uint32_t, componentCount> c32o{(uint32_t)some_res32[0], (uint32_t)some_res32[1], (uint32_t)some_res32[2], 0};
        test_color(c32i, c32o);
    }
}